

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cpp
# Opt level: O0

bool chatter::platform::SocketBind(Socket socket,HostAddress *address)

{
  uint16_t uVar1;
  uint32_t uVar2;
  int iVar3;
  undefined1 auStack_28 [4];
  int rc;
  sockaddr_in sin;
  HostAddress *address_local;
  Socket socket_local;
  
  sin.sin_family = 0;
  sin.sin_port = 0;
  sin.sin_addr.s_addr = 0;
  auStack_28._0_2_ = 2;
  auStack_28[2] = '\0';
  auStack_28[3] = '\0';
  rc._0_1_ = '\0';
  rc._1_1_ = '\0';
  rc._2_1_ = '\0';
  rc._3_1_ = '\0';
  sin.sin_zero = (uchar  [8])address;
  uVar1 = HostAddress::port(address);
  uVar1 = HostToNet16(uVar1);
  auStack_28._2_2_ = uVar1;
  uVar2 = HostAddress::address((HostAddress *)sin.sin_zero);
  rc = uVar2;
  iVar3 = bind(socket,(sockaddr *)auStack_28,0x10);
  return (bool)(-(iVar3 == 0) & 1);
}

Assistant:

bool SocketBind(Socket socket, const HostAddress& address)
{
    struct sockaddr_in sin;
    int rc;

    memset(&sin, 0, sizeof(sin));

    sin.sin_family = AF_INET;
    sin.sin_port = HostToNet16(address.port());
    sin.sin_addr.s_addr = address.address();

    rc = bind(socket, (struct sockaddr *)&sin, sizeof(sin));
    return rc == 0 ? true : false;
}